

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Geometry *pGVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  byte bVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined4 uVar65;
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [32];
  float fVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_270c;
  ulong local_2708;
  ulong local_2700;
  ulong *local_26f8;
  RayHit *local_26f0;
  RTCIntersectArguments *local_26e8;
  long local_26e0;
  RayQueryContext *local_26d8;
  Scene *local_26d0;
  long local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  undefined4 local_2684;
  undefined4 local_2680;
  undefined4 local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_249f;
  float local_2480 [4];
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  float local_2460 [4];
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  undefined4 uStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_26d8 = context;
    local_26f8 = local_2390;
    local_2398[0] = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar9 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar39._8_4_ = 0x7fffffff;
    auVar39._0_8_ = 0x7fffffff7fffffff;
    auVar39._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl((undefined1  [16])aVar1,auVar39);
    auVar72._8_4_ = 0x219392ef;
    auVar72._0_8_ = 0x219392ef219392ef;
    auVar72._12_4_ = 0x219392ef;
    uVar34 = vcmpps_avx512vl(auVar39,auVar72,1);
    bVar8 = (bool)((byte)uVar34 & 1);
    auVar40._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar1.x;
    bVar8 = (bool)((byte)(uVar34 >> 1) & 1);
    auVar40._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar1.y;
    bVar8 = (bool)((byte)(uVar34 >> 2) & 1);
    auVar40._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar1.z;
    bVar8 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar40._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * aVar1.field_3.a;
    auVar39 = vrcp14ps_avx512vl(auVar40);
    auVar41._8_4_ = 0x3f800000;
    auVar41._0_8_ = 0x3f8000003f800000;
    auVar41._12_4_ = 0x3f800000;
    auVar41 = vfnmadd213ps_avx512vl(auVar40,auVar39,auVar41);
    auVar40 = vfmadd132ps_fma(auVar41,auVar39,auVar39);
    auVar43 = vbroadcastss_avx512vl(auVar40);
    auVar85 = ZEXT3264(auVar43);
    auVar39 = vmovshdup_avx(auVar40);
    auVar43 = vbroadcastsd_avx512vl(auVar39);
    auVar86 = ZEXT3264(auVar43);
    auVar41 = vshufpd_avx(auVar40,auVar40,1);
    auVar47._8_4_ = 2;
    auVar47._0_8_ = 0x200000002;
    auVar47._12_4_ = 2;
    auVar47._16_4_ = 2;
    auVar47._20_4_ = 2;
    auVar47._24_4_ = 2;
    auVar47._28_4_ = 2;
    auVar43 = vpermps_avx512vl(auVar47,ZEXT1632(auVar40));
    auVar87 = ZEXT3264(auVar43);
    fVar59 = auVar40._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar49._4_4_ = fVar59;
    auVar49._0_4_ = fVar59;
    auVar49._8_4_ = fVar59;
    auVar49._12_4_ = fVar59;
    auVar49._16_4_ = fVar59;
    auVar49._20_4_ = fVar59;
    auVar49._24_4_ = fVar59;
    auVar49._28_4_ = fVar59;
    auVar43 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar88 = ZEXT3264(auVar43);
    auVar45 = ZEXT1632(CONCAT412(auVar40._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar40._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar40._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar59))
                                ));
    auVar44 = vpermps_avx512vl(auVar43,auVar45);
    auVar43 = vpermps_avx2(auVar47,auVar45);
    local_2700 = (ulong)(auVar40._0_4_ < 0.0) << 5;
    local_2708 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x40;
    uVar34 = (ulong)(auVar41._0_4_ < 0.0) << 5 | 0x80;
    uVar35 = local_2700 ^ 0x20;
    uVar37 = local_2708 ^ 0x20;
    uVar65 = auVar9._0_4_;
    auVar63 = ZEXT3264(CONCAT428(uVar65,CONCAT424(uVar65,CONCAT420(uVar65,CONCAT416(uVar65,CONCAT412
                                                  (uVar65,CONCAT48(uVar65,CONCAT44(uVar65,uVar65))))
                                                  ))));
    auVar46._8_4_ = 0x80000000;
    auVar46._0_8_ = 0x8000000080000000;
    auVar46._12_4_ = 0x80000000;
    auVar46._16_4_ = 0x80000000;
    auVar46._20_4_ = 0x80000000;
    auVar46._24_4_ = 0x80000000;
    auVar46._28_4_ = 0x80000000;
    auVar45 = vxorps_avx512vl(auVar49,auVar46);
    auVar89 = ZEXT3264(auVar45);
    auVar44 = vxorps_avx512vl(auVar44,auVar46);
    auVar90 = ZEXT3264(auVar44);
    auVar43 = vxorps_avx512vl(auVar43,auVar46);
    auVar91 = ZEXT3264(auVar43);
    auVar43 = vbroadcastss_avx512vl(auVar42);
    auVar92 = ZEXT3264(auVar43);
    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar93 = ZEXT3264(auVar43);
    auVar43 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar94 = ZEXT3264(auVar43);
    auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar95 = ZEXT1664(auVar42);
    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar96 = ZEXT3264(auVar43);
    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
    auVar97 = ZEXT3264(auVar43);
    local_26f0 = ray;
    do {
      pfVar3 = (float *)(local_26f8 + -1);
      local_26f8 = local_26f8 + -2;
      if (*pfVar3 <= (local_26f0->super_RayK<1>).tfar) {
        uVar36 = *local_26f8;
        while ((uVar36 & 8) == 0) {
          auVar43 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar36 + 0x40 + local_2700),auVar89._0_32_,
                               auVar85._0_32_);
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar36 + 0x40 + local_2708),auVar90._0_32_,
                               auVar86._0_32_);
          auVar43 = vpmaxsd_avx2(auVar43,auVar44);
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar36 + 0x40 + uVar34),auVar91._0_32_,
                               auVar87._0_32_);
          auVar44 = vpmaxsd_avx512vl(auVar44,auVar92._0_32_);
          auVar43 = vpmaxsd_avx2(auVar43,auVar44);
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar36 + 0x40 + uVar35),auVar89._0_32_,
                               auVar85._0_32_);
          auVar45 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar36 + 0x40 + uVar37),auVar90._0_32_,
                               auVar86._0_32_);
          auVar44 = vpminsd_avx2(auVar44,auVar45);
          auVar45 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar34 ^ 0x20)),
                               auVar91._0_32_,auVar87._0_32_);
          auVar45 = vpminsd_avx2(auVar45,auVar63._0_32_);
          auVar44 = vpminsd_avx2(auVar44,auVar45);
          uVar32 = vpcmpd_avx512vl(auVar43,auVar44,2);
          bVar26 = (byte)uVar32;
          if (bVar26 == 0) goto LAB_01f254b6;
          auVar44 = *(undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0);
          auVar45 = ((undefined1 (*) [32])(uVar36 & 0xfffffffffffffff0))[1];
          auVar46 = vmovdqa64_avx512vl(auVar93._0_32_);
          auVar46 = vpternlogd_avx512vl(auVar46,auVar43,auVar94._0_32_,0xf8);
          auVar47 = vpcompressd_avx512vl(auVar46);
          auVar48._0_4_ =
               (uint)(bVar26 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar46._0_4_;
          bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar48._4_4_ = (uint)bVar8 * auVar47._4_4_ | (uint)!bVar8 * auVar46._4_4_;
          bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar48._8_4_ = (uint)bVar8 * auVar47._8_4_ | (uint)!bVar8 * auVar46._8_4_;
          bVar8 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar48._12_4_ = (uint)bVar8 * auVar47._12_4_ | (uint)!bVar8 * auVar46._12_4_;
          bVar8 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar48._16_4_ = (uint)bVar8 * auVar47._16_4_ | (uint)!bVar8 * auVar46._16_4_;
          bVar8 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar48._20_4_ = (uint)bVar8 * auVar47._20_4_ | (uint)!bVar8 * auVar46._20_4_;
          bVar8 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar48._24_4_ = (uint)bVar8 * auVar47._24_4_ | (uint)!bVar8 * auVar46._24_4_;
          bVar8 = SUB81(uVar32 >> 7,0);
          auVar48._28_4_ = (uint)bVar8 * auVar47._28_4_ | (uint)!bVar8 * auVar46._28_4_;
          auVar46 = vpermt2q_avx512vl(auVar44,auVar48,auVar45);
          uVar36 = auVar46._0_8_;
          bVar26 = bVar26 - 1 & bVar26;
          if (bVar26 != 0) {
            auVar46 = vpshufd_avx2(auVar48,0x55);
            vpermt2q_avx512vl(auVar44,auVar46,auVar45);
            auVar47 = vpminsd_avx2(auVar48,auVar46);
            auVar46 = vpmaxsd_avx2(auVar48,auVar46);
            bVar26 = bVar26 - 1 & bVar26;
            if (bVar26 == 0) {
              auVar47 = vpermi2q_avx512vl(auVar47,auVar44,auVar45);
              uVar36 = auVar47._0_8_;
              auVar44 = vpermt2q_avx512vl(auVar44,auVar46,auVar45);
              *local_26f8 = auVar44._0_8_;
              auVar43 = vpermd_avx2(auVar46,auVar43);
              *(int *)(local_26f8 + 1) = auVar43._0_4_;
              local_26f8 = local_26f8 + 2;
            }
            else {
              auVar50 = vpshufd_avx2(auVar48,0xaa);
              vpermt2q_avx512vl(auVar44,auVar50,auVar45);
              auVar49 = vpminsd_avx2(auVar47,auVar50);
              auVar47 = vpmaxsd_avx2(auVar47,auVar50);
              auVar50 = vpminsd_avx2(auVar46,auVar47);
              auVar46 = vpmaxsd_avx2(auVar46,auVar47);
              bVar26 = bVar26 - 1 & bVar26;
              if (bVar26 == 0) {
                auVar47 = vpermi2q_avx512vl(auVar49,auVar44,auVar45);
                uVar36 = auVar47._0_8_;
                auVar47 = vpermt2q_avx512vl(auVar44,auVar46,auVar45);
                *local_26f8 = auVar47._0_8_;
                auVar46 = vpermd_avx2(auVar46,auVar43);
                *(int *)(local_26f8 + 1) = auVar46._0_4_;
                auVar44 = vpermt2q_avx512vl(auVar44,auVar50,auVar45);
                local_26f8[2] = auVar44._0_8_;
                auVar43 = vpermd_avx2(auVar50,auVar43);
                *(int *)(local_26f8 + 3) = auVar43._0_4_;
                local_26f8 = local_26f8 + 4;
              }
              else {
                auVar47 = vpshufd_avx2(auVar48,0xff);
                vpermt2q_avx512vl(auVar44,auVar47,auVar45);
                auVar54 = vpminsd_avx2(auVar49,auVar47);
                auVar47 = vpmaxsd_avx2(auVar49,auVar47);
                auVar49 = vpminsd_avx2(auVar50,auVar47);
                auVar47 = vpmaxsd_avx2(auVar50,auVar47);
                auVar50 = vpminsd_avx2(auVar46,auVar47);
                auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                bVar26 = bVar26 - 1 & bVar26;
                if (bVar26 == 0) {
                  auVar47 = vpermi2q_avx512vl(auVar54,auVar44,auVar45);
                  uVar36 = auVar47._0_8_;
                  auVar47 = vpermt2q_avx512vl(auVar44,auVar46,auVar45);
                  *local_26f8 = auVar47._0_8_;
                  auVar46 = vpermd_avx2(auVar46,auVar43);
                  *(int *)(local_26f8 + 1) = auVar46._0_4_;
                  auVar46 = vpermt2q_avx512vl(auVar44,auVar50,auVar45);
                  local_26f8[2] = auVar46._0_8_;
                  auVar46 = vpermd_avx2(auVar50,auVar43);
                  *(int *)(local_26f8 + 3) = auVar46._0_4_;
                  auVar44 = vpermt2q_avx512vl(auVar44,auVar49,auVar45);
                  local_26f8[4] = auVar44._0_8_;
                  auVar43 = vpermd_avx2(auVar49,auVar43);
                  *(int *)(local_26f8 + 5) = auVar43._0_4_;
                  local_26f8 = local_26f8 + 6;
                }
                else {
                  auVar48 = valignd_avx512vl(auVar48,auVar48,3);
                  auVar47 = vmovdqa64_avx512vl(auVar95._0_32_);
                  auVar47 = vpermt2d_avx512vl(auVar47,auVar96._0_32_,auVar54);
                  auVar47 = vpermt2d_avx512vl(auVar47,auVar97._0_32_,auVar49);
                  auVar49 = vpermt2d_avx512vl(auVar47,auVar97._0_32_,auVar50);
                  auVar47 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar46 = vpermt2d_avx512vl(auVar49,auVar47,auVar46);
                  auVar71 = ZEXT3264(auVar46);
                  bVar30 = bVar26;
                  do {
                    auVar47 = auVar71._0_32_;
                    auVar46 = vpermps_avx512vl(auVar88._0_32_,auVar48);
                    auVar48 = valignd_avx512vl(auVar48,auVar48,1);
                    vpermt2q_avx512vl(auVar44,auVar48,auVar45);
                    bVar30 = bVar30 - 1 & bVar30;
                    uVar18 = vpcmpd_avx512vl(auVar46,auVar47,5);
                    auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                    bVar33 = (byte)uVar18 << 1;
                    auVar47 = valignd_avx512vl(auVar47,auVar47,7);
                    bVar8 = (bool)((byte)uVar18 & 1);
                    auVar50._4_4_ = (uint)bVar8 * auVar47._4_4_ | (uint)!bVar8 * auVar46._4_4_;
                    auVar50._0_4_ = auVar46._0_4_;
                    bVar8 = (bool)(bVar33 >> 2 & 1);
                    auVar50._8_4_ = (uint)bVar8 * auVar47._8_4_ | (uint)!bVar8 * auVar46._8_4_;
                    bVar8 = (bool)(bVar33 >> 3 & 1);
                    auVar50._12_4_ = (uint)bVar8 * auVar47._12_4_ | (uint)!bVar8 * auVar46._12_4_;
                    bVar8 = (bool)(bVar33 >> 4 & 1);
                    auVar50._16_4_ = (uint)bVar8 * auVar47._16_4_ | (uint)!bVar8 * auVar46._16_4_;
                    bVar8 = (bool)(bVar33 >> 5 & 1);
                    auVar50._20_4_ = (uint)bVar8 * auVar47._20_4_ | (uint)!bVar8 * auVar46._20_4_;
                    bVar8 = (bool)(bVar33 >> 6 & 1);
                    auVar50._24_4_ = (uint)bVar8 * auVar47._24_4_ | (uint)!bVar8 * auVar46._24_4_;
                    auVar50._28_4_ =
                         (uint)(bVar33 >> 7) * auVar47._28_4_ |
                         (uint)!(bool)(bVar33 >> 7) * auVar46._28_4_;
                    auVar71 = ZEXT3264(auVar50);
                  } while (bVar30 != 0);
                  lVar28 = (ulong)(uint)POPCOUNT((uint)bVar26) + 3;
                  do {
                    auVar46 = vpermi2q_avx512vl(auVar50,auVar44,auVar45);
                    *local_26f8 = auVar46._0_8_;
                    auVar47 = auVar71._0_32_;
                    auVar46 = vpermd_avx2(auVar47,auVar43);
                    *(int *)(local_26f8 + 1) = auVar46._0_4_;
                    auVar50 = valignd_avx512vl(auVar47,auVar47,1);
                    local_26f8 = local_26f8 + 2;
                    auVar71 = ZEXT3264(auVar50);
                    lVar28 = lVar28 + -1;
                  } while (lVar28 != 0);
                  auVar43 = vpermt2q_avx512vl(auVar44,auVar50,auVar45);
                  uVar36 = auVar43._0_8_;
                }
              }
            }
          }
        }
        local_26c8 = (ulong)((uint)uVar36 & 0xf) - 8;
        if (local_26c8 != 0) {
          uVar36 = uVar36 & 0xfffffffffffffff0;
          local_26d0 = local_26d8->scene;
          local_26e0 = 0;
          do {
            lVar29 = local_26e0 * 0x60;
            ppfVar2 = (local_26d0->vertices).items;
            pfVar3 = ppfVar2[*(uint *)(uVar36 + 0x48 + lVar29)];
            auVar64._16_16_ = *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar36 + 0x28 + lVar29));
            auVar64._0_16_ = *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar36 + 8 + lVar29));
            pfVar4 = ppfVar2[*(uint *)(uVar36 + 0x40 + lVar29)];
            auVar67._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar36 + 0x20 + lVar29));
            auVar67._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar36 + lVar29));
            pfVar5 = ppfVar2[*(uint *)(uVar36 + 0x4c + lVar29)];
            auVar75._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0x2c + lVar29));
            auVar75._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar36 + 0xc + lVar29));
            pfVar6 = ppfVar2[*(uint *)(uVar36 + 0x44 + lVar29)];
            auVar78._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 0x24 + lVar29));
            auVar78._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar36 + 4 + lVar29));
            lVar28 = uVar36 + 0x40 + lVar29;
            local_23c0 = *(undefined8 *)(lVar28 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar28 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar28 = uVar36 + 0x50 + lVar29;
            local_2540 = *(undefined8 *)(lVar28 + 0x10);
            uStack_2538 = *(undefined8 *)(lVar28 + 0x18);
            auVar39 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar36 + 0x10 + lVar29)),
                                    *(undefined1 (*) [16])
                                     (pfVar3 + *(uint *)(uVar36 + 0x18 + lVar29)));
            auVar42 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar36 + 0x10 + lVar29)),
                                    *(undefined1 (*) [16])
                                     (pfVar3 + *(uint *)(uVar36 + 0x18 + lVar29)));
            auVar41 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar36 + 0x14 + lVar29)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar36 + 0x1c + lVar29)));
            auVar9 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar36 + 0x14 + lVar29)),
                                   *(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar36 + 0x1c + lVar29)));
            auVar40 = vunpcklps_avx(auVar42,auVar9);
            auVar72 = vunpcklps_avx(auVar39,auVar41);
            auVar42 = vunpckhps_avx(auVar39,auVar41);
            auVar41 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar36 + 0x30 + lVar29)),
                                    *(undefined1 (*) [16])
                                     (pfVar3 + *(uint *)(uVar36 + 0x38 + lVar29)));
            auVar9 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar4 + *(uint *)(uVar36 + 0x30 + lVar29)),
                                   *(undefined1 (*) [16])
                                    (pfVar3 + *(uint *)(uVar36 + 0x38 + lVar29)));
            auVar13 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar36 + 0x34 + lVar29)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar36 + 0x3c + lVar29)));
            auVar39 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar36 + 0x34 + lVar29)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar36 + 0x3c + lVar29)));
            auVar39 = vunpcklps_avx(auVar9,auVar39);
            auVar14 = vunpcklps_avx(auVar41,auVar13);
            auVar9 = vunpckhps_avx(auVar41,auVar13);
            uStack_2530 = local_2540;
            uStack_2528 = uStack_2538;
            auVar43 = vunpcklps_avx(auVar78,auVar75);
            auVar44 = vunpcklps_avx(auVar67,auVar64);
            auVar50 = vunpcklps_avx(auVar44,auVar43);
            auVar48 = vunpckhps_avx(auVar44,auVar43);
            auVar43 = vunpckhps_avx(auVar78,auVar75);
            auVar44 = vunpckhps_avx(auVar67,auVar64);
            auVar54 = vunpcklps_avx(auVar44,auVar43);
            auVar43._16_16_ = auVar72;
            auVar43._0_16_ = auVar72;
            auVar44._16_16_ = auVar42;
            auVar44._0_16_ = auVar42;
            auVar45._16_16_ = auVar40;
            auVar45._0_16_ = auVar40;
            auVar76._16_16_ = auVar14;
            auVar76._0_16_ = auVar14;
            auVar73._16_16_ = auVar9;
            auVar73._0_16_ = auVar9;
            auVar60._16_16_ = auVar39;
            auVar60._0_16_ = auVar39;
            auVar43 = vsubps_avx(auVar50,auVar43);
            auVar44 = vsubps_avx(auVar48,auVar44);
            auVar45 = vsubps_avx(auVar54,auVar45);
            auVar46 = vsubps_avx(auVar76,auVar50);
            auVar47 = vsubps_avx(auVar73,auVar48);
            auVar49 = vsubps_avx(auVar60,auVar54);
            auVar52._4_4_ = auVar44._4_4_ * auVar49._4_4_;
            auVar52._0_4_ = auVar44._0_4_ * auVar49._0_4_;
            auVar52._8_4_ = auVar44._8_4_ * auVar49._8_4_;
            auVar52._12_4_ = auVar44._12_4_ * auVar49._12_4_;
            auVar52._16_4_ = auVar44._16_4_ * auVar49._16_4_;
            auVar52._20_4_ = auVar44._20_4_ * auVar49._20_4_;
            auVar52._24_4_ = auVar44._24_4_ * auVar49._24_4_;
            auVar52._28_4_ = auVar39._12_4_;
            auVar9 = vfmsub231ps_fma(auVar52,auVar47,auVar45);
            auVar23._4_4_ = auVar45._4_4_ * auVar46._4_4_;
            auVar23._0_4_ = auVar45._0_4_ * auVar46._0_4_;
            auVar23._8_4_ = auVar45._8_4_ * auVar46._8_4_;
            auVar23._12_4_ = auVar45._12_4_ * auVar46._12_4_;
            auVar23._16_4_ = auVar45._16_4_ * auVar46._16_4_;
            auVar23._20_4_ = auVar45._20_4_ * auVar46._20_4_;
            auVar23._24_4_ = auVar45._24_4_ * auVar46._24_4_;
            auVar23._28_4_ = auVar40._12_4_;
            auVar39 = vfmsub231ps_fma(auVar23,auVar49,auVar43);
            auVar24._4_4_ = auVar43._4_4_ * auVar47._4_4_;
            auVar24._0_4_ = auVar43._0_4_ * auVar47._0_4_;
            auVar24._8_4_ = auVar43._8_4_ * auVar47._8_4_;
            auVar24._12_4_ = auVar43._12_4_ * auVar47._12_4_;
            auVar24._16_4_ = auVar43._16_4_ * auVar47._16_4_;
            auVar24._20_4_ = auVar43._20_4_ * auVar47._20_4_;
            auVar24._24_4_ = auVar43._24_4_ * auVar47._24_4_;
            auVar24._28_4_ = auVar72._12_4_;
            uVar65 = *(undefined4 *)&(local_26f0->super_RayK<1>).dir.field_0;
            auVar84._4_4_ = uVar65;
            auVar84._0_4_ = uVar65;
            auVar84._8_4_ = uVar65;
            auVar84._12_4_ = uVar65;
            auVar84._16_4_ = uVar65;
            auVar84._20_4_ = uVar65;
            auVar84._24_4_ = uVar65;
            auVar84._28_4_ = uVar65;
            auVar51 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_26f0->super_RayK<1>).dir.field_0.m128[1]));
            auVar52 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_26f0->super_RayK<1>).dir.field_0.m128[2]));
            uVar65 = *(undefined4 *)&(local_26f0->super_RayK<1>).org.field_0;
            auVar53._4_4_ = uVar65;
            auVar53._0_4_ = uVar65;
            auVar53._8_4_ = uVar65;
            auVar53._12_4_ = uVar65;
            auVar53._16_4_ = uVar65;
            auVar53._20_4_ = uVar65;
            auVar53._24_4_ = uVar65;
            auVar53._28_4_ = uVar65;
            auVar50 = vsubps_avx512vl(auVar50,auVar53);
            auVar41 = vfmsub231ps_fma(auVar24,auVar46,auVar44);
            uVar65 = *(undefined4 *)((long)&(local_26f0->super_RayK<1>).org.field_0 + 4);
            auVar55._4_4_ = uVar65;
            auVar55._0_4_ = uVar65;
            auVar55._8_4_ = uVar65;
            auVar55._12_4_ = uVar65;
            auVar55._16_4_ = uVar65;
            auVar55._20_4_ = uVar65;
            auVar55._24_4_ = uVar65;
            auVar55._28_4_ = uVar65;
            auVar48 = vsubps_avx512vl(auVar48,auVar55);
            uVar65 = *(undefined4 *)((long)&(local_26f0->super_RayK<1>).org.field_0 + 8);
            auVar56._4_4_ = uVar65;
            auVar56._0_4_ = uVar65;
            auVar56._8_4_ = uVar65;
            auVar56._12_4_ = uVar65;
            auVar56._16_4_ = uVar65;
            auVar56._20_4_ = uVar65;
            auVar56._24_4_ = uVar65;
            auVar56._28_4_ = uVar65;
            auVar53 = vsubps_avx512vl(auVar54,auVar56);
            auVar54 = vmulps_avx512vl(auVar51,auVar53);
            auVar55 = vfmsub231ps_avx512vl(auVar54,auVar48,auVar52);
            auVar54 = vmulps_avx512vl(auVar52,auVar50);
            auVar40 = vfmsub231ps_fma(auVar54,auVar53,auVar84);
            auVar54 = vmulps_avx512vl(auVar84,auVar48);
            auVar56 = vfmsub231ps_avx512vl(auVar54,auVar50,auVar51);
            auVar54 = vmulps_avx512vl(ZEXT1632(auVar41),auVar52);
            auVar54 = vfmadd231ps_avx512vl(auVar54,ZEXT1632(auVar39),auVar51);
            local_24c0 = vfmadd231ps_avx512vl(auVar54,ZEXT1632(auVar9),auVar84);
            auVar54._8_4_ = 0x7fffffff;
            auVar54._0_8_ = 0x7fffffff7fffffff;
            auVar54._12_4_ = 0x7fffffff;
            auVar54._16_4_ = 0x7fffffff;
            auVar54._20_4_ = 0x7fffffff;
            auVar54._24_4_ = 0x7fffffff;
            auVar54._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_24c0,auVar54);
            auVar49 = vmulps_avx512vl(auVar49,auVar56);
            auVar42 = vfmadd231ps_fma(auVar49,ZEXT1632(auVar40),auVar47);
            auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar55,auVar46);
            auVar51._8_4_ = 0x80000000;
            auVar51._0_8_ = 0x8000000080000000;
            auVar51._12_4_ = 0x80000000;
            auVar51._16_4_ = 0x80000000;
            auVar51._20_4_ = 0x80000000;
            auVar51._24_4_ = 0x80000000;
            auVar51._28_4_ = 0x80000000;
            auVar46 = vandpd_avx512vl(local_24c0,auVar51);
            uVar38 = auVar46._0_4_;
            auVar74._0_4_ = (float)(uVar38 ^ auVar42._0_4_);
            uVar27 = auVar46._4_4_;
            auVar74._4_4_ = (float)(uVar27 ^ auVar42._4_4_);
            uVar31 = auVar46._8_4_;
            auVar74._8_4_ = (float)(uVar31 ^ auVar42._8_4_);
            uVar79 = auVar46._12_4_;
            auVar74._12_4_ = (float)(uVar79 ^ auVar42._12_4_);
            fVar59 = auVar46._16_4_;
            auVar74._16_4_ = fVar59;
            fVar80 = auVar46._20_4_;
            auVar74._20_4_ = fVar80;
            fVar81 = auVar46._24_4_;
            auVar74._24_4_ = fVar81;
            fVar82 = auVar46._28_4_;
            auVar74._28_4_ = fVar82;
            auVar45 = vmulps_avx512vl(auVar45,auVar56);
            auVar42 = vfmadd231ps_fma(auVar45,auVar44,ZEXT1632(auVar40));
            auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar43,auVar55);
            auVar77._0_4_ = (float)(uVar38 ^ auVar42._0_4_);
            auVar77._4_4_ = (float)(uVar27 ^ auVar42._4_4_);
            auVar77._8_4_ = (float)(uVar31 ^ auVar42._8_4_);
            auVar77._12_4_ = (float)(uVar79 ^ auVar42._12_4_);
            auVar77._16_4_ = fVar59;
            auVar77._20_4_ = fVar80;
            auVar77._24_4_ = fVar81;
            auVar77._28_4_ = fVar82;
            uVar18 = vcmpps_avx512vl(auVar74,ZEXT832(0) << 0x20,5);
            uVar15 = vcmpps_avx512vl(auVar77,ZEXT832(0) << 0x20,5);
            uVar16 = vcmpps_avx512vl(local_24c0,ZEXT832(0) << 0x20,4);
            auVar83._0_4_ = auVar74._0_4_ + auVar77._0_4_;
            auVar83._4_4_ = auVar74._4_4_ + auVar77._4_4_;
            auVar83._8_4_ = auVar74._8_4_ + auVar77._8_4_;
            auVar83._12_4_ = auVar74._12_4_ + auVar77._12_4_;
            auVar83._16_4_ = fVar59 + fVar59;
            auVar83._20_4_ = fVar80 + fVar80;
            auVar83._24_4_ = fVar81 + fVar81;
            auVar83._28_4_ = fVar82 + fVar82;
            uVar17 = vcmpps_avx512vl(auVar83,local_24c0,2);
            local_249f = (byte)uVar18 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
            if (local_249f != 0) {
              auVar25._4_4_ = auVar53._4_4_ * auVar41._4_4_;
              auVar25._0_4_ = auVar53._0_4_ * auVar41._0_4_;
              auVar25._8_4_ = auVar53._8_4_ * auVar41._8_4_;
              auVar25._12_4_ = auVar53._12_4_ * auVar41._12_4_;
              auVar25._16_4_ = auVar53._16_4_ * 0.0;
              auVar25._20_4_ = auVar53._20_4_ * 0.0;
              auVar25._24_4_ = auVar53._24_4_ * 0.0;
              auVar25._28_4_ = auVar53._28_4_;
              auVar42 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar39),auVar25);
              auVar42 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar9),ZEXT1632(auVar42));
              local_24e0._0_4_ = (float)(uVar38 ^ auVar42._0_4_);
              local_24e0._4_4_ = (float)(uVar27 ^ auVar42._4_4_);
              local_24e0._8_4_ = (float)(uVar31 ^ auVar42._8_4_);
              local_24e0._12_4_ = (float)(uVar79 ^ auVar42._12_4_);
              local_24e0._16_4_ = fVar59;
              local_24e0._20_4_ = fVar80;
              local_24e0._24_4_ = fVar81;
              local_24e0._28_4_ = fVar82;
              uVar65 = *(undefined4 *)((long)&(local_26f0->super_RayK<1>).org.field_0 + 0xc);
              auVar19._4_4_ = uVar65;
              auVar19._0_4_ = uVar65;
              auVar19._8_4_ = uVar65;
              auVar19._12_4_ = uVar65;
              auVar19._16_4_ = uVar65;
              auVar19._20_4_ = uVar65;
              auVar19._24_4_ = uVar65;
              auVar19._28_4_ = uVar65;
              auVar43 = vmulps_avx512vl(local_24c0,auVar19);
              uVar18 = vcmpps_avx512vl(auVar43,local_24e0,1);
              fVar66 = (local_26f0->super_RayK<1>).tfar;
              auVar20._4_4_ = fVar66;
              auVar20._0_4_ = fVar66;
              auVar20._8_4_ = fVar66;
              auVar20._12_4_ = fVar66;
              auVar20._16_4_ = fVar66;
              auVar20._20_4_ = fVar66;
              auVar20._24_4_ = fVar66;
              auVar20._28_4_ = fVar66;
              auVar43 = vmulps_avx512vl(local_24c0,auVar20);
              uVar15 = vcmpps_avx512vl(local_24e0,auVar43,2);
              local_249f = (byte)uVar18 & (byte)uVar15 & local_249f;
              uVar38 = (uint)local_249f;
              if (local_249f != 0) {
                auVar43 = *(undefined1 (*) [32])&(local_26f0->super_RayK<1>).tfar;
                auVar71 = ZEXT3264(auVar43);
                uVar27 = vextractps_avx(auVar43._0_16_,1);
                auVar43 = vsubps_avx(local_24c0,auVar77);
                local_2520 = vblendps_avx(auVar74,auVar43,0xf0);
                auVar43 = vsubps_avx(local_24c0,auVar74);
                local_2500 = vblendps_avx(auVar77,auVar43,0xf0);
                fVar66 = (float)DAT_01fef940;
                local_2420._0_4_ = auVar9._0_4_ * fVar66;
                fVar68 = DAT_01fef940._4_4_;
                local_2420._4_4_ = auVar9._4_4_ * fVar68;
                fVar69 = DAT_01fef940._8_4_;
                local_2420._8_4_ = auVar9._8_4_ * fVar69;
                fVar70 = DAT_01fef940._12_4_;
                local_2420._12_4_ = auVar9._12_4_ * fVar70;
                fVar10 = DAT_01fef940._16_4_;
                local_2420._16_4_ = fVar10 * 0.0;
                fVar11 = DAT_01fef940._20_4_;
                local_2420._20_4_ = fVar11 * 0.0;
                fVar12 = DAT_01fef940._24_4_;
                local_2420._24_4_ = fVar12 * 0.0;
                local_2420._28_4_ = 0;
                local_2400._4_4_ = auVar39._4_4_ * fVar68;
                local_2400._0_4_ = auVar39._0_4_ * fVar66;
                local_2400._8_4_ = auVar39._8_4_ * fVar69;
                local_2400._12_4_ = auVar39._12_4_ * fVar70;
                local_2400._16_4_ = fVar10 * 0.0;
                local_2400._20_4_ = fVar11 * 0.0;
                local_2400._24_4_ = fVar12 * 0.0;
                local_2400._28_4_ = 0;
                local_23e0._4_4_ = auVar41._4_4_ * fVar68;
                local_23e0._0_4_ = auVar41._0_4_ * fVar66;
                local_23e0._8_4_ = auVar41._8_4_ * fVar69;
                local_23e0._12_4_ = auVar41._12_4_ * fVar70;
                local_23e0._16_4_ = fVar10 * 0.0;
                local_23e0._20_4_ = fVar11 * 0.0;
                local_23e0._24_4_ = fVar12 * 0.0;
                local_23e0._28_4_ = 0;
                auVar43 = vrcp14ps_avx512vl(local_24c0);
                auVar21._8_4_ = 0x3f800000;
                auVar21._0_8_ = 0x3f8000003f800000;
                auVar21._12_4_ = 0x3f800000;
                auVar21._16_4_ = 0x3f800000;
                auVar21._20_4_ = 0x3f800000;
                auVar21._24_4_ = 0x3f800000;
                auVar21._28_4_ = 0x3f800000;
                auVar44 = vfnmadd213ps_avx512vl(local_24c0,auVar43,auVar21);
                auVar42 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
                fVar66 = auVar42._0_4_;
                fVar68 = auVar42._4_4_;
                local_2440._4_4_ = fVar68 * local_24e0._4_4_;
                local_2440._0_4_ = fVar66 * local_24e0._0_4_;
                fVar69 = auVar42._8_4_;
                local_2440._8_4_ = fVar69 * local_24e0._8_4_;
                fVar70 = auVar42._12_4_;
                local_2440._12_4_ = fVar70 * local_24e0._12_4_;
                local_2440._16_4_ = fVar59 * 0.0;
                local_2440._20_4_ = fVar80 * 0.0;
                local_2440._24_4_ = fVar81 * 0.0;
                local_2440._28_4_ = fVar82;
                auVar63 = ZEXT3264(local_2440);
                local_2480[0] = local_2520._0_4_ * fVar66;
                local_2480[1] = local_2520._4_4_ * fVar68;
                local_2480[2] = local_2520._8_4_ * fVar69;
                local_2480[3] = local_2520._12_4_ * fVar70;
                fStack_2470 = local_2520._16_4_ * 0.0;
                fStack_246c = local_2520._20_4_ * 0.0;
                fStack_2468 = local_2520._24_4_ * 0.0;
                uStack_2464 = auVar43._28_4_;
                local_2460[0] = local_2500._0_4_ * fVar66;
                local_2460[1] = local_2500._4_4_ * fVar68;
                local_2460[2] = local_2500._8_4_ * fVar69;
                local_2460[3] = local_2500._12_4_ * fVar70;
                fStack_2450 = local_2500._16_4_ * 0.0;
                fStack_244c = local_2500._20_4_ * 0.0;
                fStack_2448 = local_2500._24_4_ * 0.0;
                uStack_2444 = auVar43._28_4_;
                auVar61._8_4_ = 0x7f800000;
                auVar61._0_8_ = 0x7f8000007f800000;
                auVar61._12_4_ = 0x7f800000;
                auVar61._16_4_ = 0x7f800000;
                auVar61._20_4_ = 0x7f800000;
                auVar61._24_4_ = 0x7f800000;
                auVar61._28_4_ = 0x7f800000;
                auVar43 = vblendmps_avx512vl(auVar61,local_2440);
                auVar57._0_4_ =
                     (uint)(local_249f & 1) * auVar43._0_4_ |
                     (uint)!(bool)(local_249f & 1) * 0x7f800000;
                bVar8 = (bool)(local_249f >> 1 & 1);
                auVar57._4_4_ = (uint)bVar8 * auVar43._4_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_249f >> 2 & 1);
                auVar57._8_4_ = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_249f >> 3 & 1);
                auVar57._12_4_ = (uint)bVar8 * auVar43._12_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_249f >> 4 & 1);
                auVar57._16_4_ = (uint)bVar8 * auVar43._16_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_249f >> 5 & 1);
                auVar57._20_4_ = (uint)bVar8 * auVar43._20_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_249f >> 6 & 1);
                auVar57._24_4_ = (uint)bVar8 * auVar43._24_4_ | (uint)!bVar8 * 0x7f800000;
                auVar57._28_4_ =
                     (uint)(local_249f >> 7) * auVar43._28_4_ |
                     (uint)!(bool)(local_249f >> 7) * 0x7f800000;
                auVar43 = vshufps_avx(auVar57,auVar57,0xb1);
                auVar43 = vminps_avx(auVar57,auVar43);
                auVar44 = vshufpd_avx(auVar43,auVar43,5);
                auVar43 = vminps_avx(auVar43,auVar44);
                auVar44 = vpermpd_avx2(auVar43,0x4e);
                auVar43 = vminps_avx(auVar43,auVar44);
                uVar18 = vcmpps_avx512vl(auVar57,auVar43,0);
                bVar26 = local_249f & (byte)uVar18;
                do {
                  bVar33 = (byte)uVar38;
                  bVar30 = bVar33;
                  if (bVar26 != 0) {
                    bVar30 = bVar26;
                  }
                  uVar38 = 0;
                  for (uVar31 = (uint)bVar30; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000)
                  {
                    uVar38 = uVar38 + 1;
                  }
                  local_2678 = *(uint *)((long)&local_23c0 + (ulong)uVar38 * 4);
                  pGVar7 = (local_26d0->geometries).items[local_2678].ptr;
                  if ((pGVar7->mask & uVar27) == 0) {
                    uVar38 = (uint)(~(byte)(1 << (uVar38 & 0x1f)) & bVar33);
                  }
                  else {
                    local_26e8 = local_26d8->args;
                    local_2660 = auVar71._0_32_;
                    local_2640 = auVar63._0_32_;
                    local_2620 = auVar92._0_32_;
                    local_2600 = auVar91._0_32_;
                    local_25e0 = auVar90._0_32_;
                    local_25c0 = auVar89._0_32_;
                    local_25a0 = auVar87._0_32_;
                    local_2580 = auVar86._0_32_;
                    local_2560 = auVar85._0_32_;
                    if (local_26d8->args->filter == (RTCFilterFunctionN)0x0) {
                      local_26c0.context = local_26d8->user;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar32 = (ulong)(uVar38 << 2);
                        fVar59 = *(float *)((long)local_2480 + uVar32);
                        fVar80 = *(float *)((long)local_2460 + uVar32);
                        (local_26f0->super_RayK<1>).tfar = *(float *)(local_2440 + uVar32);
                        (local_26f0->Ng).field_0.field_0.x = *(float *)(local_2420 + uVar32);
                        (local_26f0->Ng).field_0.field_0.y = *(float *)(local_2400 + uVar32);
                        (local_26f0->Ng).field_0.field_0.z = *(float *)(local_23e0 + uVar32);
                        local_26f0->u = fVar59;
                        local_26f0->v = fVar80;
                        local_26f0->primID = *(uint *)((long)&local_2540 + uVar32);
                        local_26f0->geomID = local_2678;
                        local_26f0->instID[0] = (local_26c0.context)->instID[0];
                        local_26f0->instPrimID[0] = (local_26c0.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_26c0.context = local_26d8->user;
                    }
                    uVar32 = (ulong)(uVar38 * 4);
                    local_2690 = *(float *)(local_2420 + uVar32);
                    local_268c = *(undefined4 *)(local_2400 + uVar32);
                    local_2688 = *(undefined4 *)(local_23e0 + uVar32);
                    local_2684 = *(undefined4 *)((long)local_2480 + uVar32);
                    local_2680 = *(undefined4 *)((long)local_2460 + uVar32);
                    local_267c = *(undefined4 *)((long)&local_2540 + uVar32);
                    local_2674 = (local_26c0.context)->instID[0];
                    local_2670 = (local_26c0.context)->instPrimID[0];
                    (local_26f0->super_RayK<1>).tfar = *(float *)(local_2440 + uVar32);
                    local_270c = -1;
                    local_26c0.valid = &local_270c;
                    local_26c0.geometryUserPtr = pGVar7->userPtr;
                    local_26c0.ray = (RTCRayN *)local_26f0;
                    local_26c0.hit = (RTCHitN *)&local_2690;
                    local_26c0.N = 1;
                    if (((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar7->intersectionFilterN)(&local_26c0), *local_26c0.valid != 0)) &&
                       ((local_26e8->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_26e8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((pGVar7->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_26e8->filter)(&local_26c0), *local_26c0.valid != 0)))))) {
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_26c0.hit;
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_26c0.hit + 4);
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_26c0.hit + 8);
                      *(float *)((long)local_26c0.ray + 0x3c) = *(float *)(local_26c0.hit + 0xc);
                      *(float *)((long)local_26c0.ray + 0x40) = *(float *)(local_26c0.hit + 0x10);
                      *(float *)((long)local_26c0.ray + 0x44) = *(float *)(local_26c0.hit + 0x14);
                      *(float *)((long)local_26c0.ray + 0x48) = *(float *)(local_26c0.hit + 0x18);
                      *(float *)((long)local_26c0.ray + 0x4c) = *(float *)(local_26c0.hit + 0x1c);
                      *(float *)((long)local_26c0.ray + 0x50) = *(float *)(local_26c0.hit + 0x20);
                    }
                    else {
                      (local_26f0->super_RayK<1>).tfar = (float)local_2660._0_4_;
                    }
                    auVar63 = ZEXT3264(local_2640);
                    fVar59 = (local_26f0->super_RayK<1>).tfar;
                    auVar22._4_4_ = fVar59;
                    auVar22._0_4_ = fVar59;
                    auVar22._8_4_ = fVar59;
                    auVar22._12_4_ = fVar59;
                    auVar22._16_4_ = fVar59;
                    auVar22._20_4_ = fVar59;
                    auVar22._24_4_ = fVar59;
                    auVar22._28_4_ = fVar59;
                    uVar18 = vcmpps_avx512vl(local_2640,auVar22,2);
                    uVar38 = (uint)(~(byte)(1 << (uVar38 & 0x1f)) & bVar33) & (uint)uVar18;
                    uVar27 = (local_26f0->super_RayK<1>).mask;
                    auVar71 = ZEXT464((uint)(local_26f0->super_RayK<1>).tfar);
                    auVar85 = ZEXT3264(local_2560);
                    auVar86 = ZEXT3264(local_2580);
                    auVar87 = ZEXT3264(local_25a0);
                    auVar43 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar88 = ZEXT3264(auVar43);
                    auVar89 = ZEXT3264(local_25c0);
                    auVar90 = ZEXT3264(local_25e0);
                    auVar91 = ZEXT3264(local_2600);
                    auVar92 = ZEXT3264(local_2620);
                    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar93 = ZEXT3264(auVar43);
                    auVar43 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar94 = ZEXT3264(auVar43);
                    auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar95 = ZEXT1664(auVar42);
                    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar96 = ZEXT3264(auVar43);
                    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                    auVar97 = ZEXT3264(auVar43);
                  }
                  bVar26 = (byte)uVar38;
                  if (bVar26 == 0) break;
                  auVar62._8_4_ = 0x7f800000;
                  auVar62._0_8_ = 0x7f8000007f800000;
                  auVar62._12_4_ = 0x7f800000;
                  auVar62._16_4_ = 0x7f800000;
                  auVar62._20_4_ = 0x7f800000;
                  auVar62._24_4_ = 0x7f800000;
                  auVar62._28_4_ = 0x7f800000;
                  auVar43 = vblendmps_avx512vl(auVar62,auVar63._0_32_);
                  auVar58._0_4_ =
                       (uint)(bVar26 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
                  bVar8 = (bool)((byte)(uVar38 >> 1) & 1);
                  auVar58._4_4_ = (uint)bVar8 * auVar43._4_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
                  auVar58._8_4_ = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)((byte)(uVar38 >> 3) & 1);
                  auVar58._12_4_ = (uint)bVar8 * auVar43._12_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)((byte)(uVar38 >> 4) & 1);
                  auVar58._16_4_ = (uint)bVar8 * auVar43._16_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)((byte)(uVar38 >> 5) & 1);
                  auVar58._20_4_ = (uint)bVar8 * auVar43._20_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)((byte)(uVar38 >> 6) & 1);
                  auVar58._24_4_ = (uint)bVar8 * auVar43._24_4_ | (uint)!bVar8 * 0x7f800000;
                  auVar58._28_4_ =
                       (uVar38 >> 7) * auVar43._28_4_ | (uint)!SUB41(uVar38 >> 7,0) * 0x7f800000;
                  auVar43 = vshufps_avx(auVar58,auVar58,0xb1);
                  auVar43 = vminps_avx(auVar58,auVar43);
                  auVar44 = vshufpd_avx(auVar43,auVar43,5);
                  auVar43 = vminps_avx(auVar43,auVar44);
                  auVar44 = vpermpd_avx2(auVar43,0x4e);
                  auVar43 = vminps_avx(auVar43,auVar44);
                  uVar18 = vcmpps_avx512vl(auVar58,auVar43,0);
                  bVar26 = (byte)uVar18 & bVar26;
                } while( true );
              }
            }
            local_26e0 = local_26e0 + 1;
          } while (local_26e0 != local_26c8);
        }
        fVar59 = (local_26f0->super_RayK<1>).tfar;
        auVar63 = ZEXT3264(CONCAT428(fVar59,CONCAT424(fVar59,CONCAT420(fVar59,CONCAT416(fVar59,
                                                  CONCAT412(fVar59,CONCAT48(fVar59,CONCAT44(fVar59,
                                                  fVar59))))))));
      }
LAB_01f254b6:
    } while (local_26f8 != &local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }